

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
HecrSequential_cyclicReductionExtendedMatrix_Test::TestBody
          (HecrSequential_cyclicReductionExtendedMatrix_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_390;
  Message local_388;
  double local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar;
  vec solution;
  vec xs;
  double xs_values [15];
  vec rhs;
  double rhs_values [15];
  TridiagonalMatrix m;
  vec cs;
  double cs_values [15];
  undefined1 local_140 [8];
  vec bs;
  double bs_values [15];
  vec as;
  double as_values [15];
  int size;
  HecrSequential_cyclicReductionExtendedMatrix_Test *this_local;
  
  as.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4008000000000000;
  make_vector((vec *)(bs_values + 0xe),0xf,
              (double *)
              &as.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  bs_values[0xb] = 0.0;
  bs_values[0xc] = 0.0;
  bs_values[9] = 0.0;
  bs_values[10] = 0.0;
  bs_values[7] = -2.0;
  bs_values[8] = 0.0;
  bs_values[5] = 1.0;
  bs_values[6] = -0.3;
  bs_values[3] = 3.2;
  bs_values[4] = 2.0;
  bs_values[1] = 2.0;
  bs_values[2] = 1.1;
  bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bs_values[0] = -1.0;
  bs_values[0xd] = 0.0;
  make_vector((vec *)local_140,0xf,
              (double *)
              &bs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4000000000000000;
  make_vector((vec *)&m.size,0xf,
              (double *)
              &cs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  TridiagonalMatrix::TridiagonalMatrix
            ((TridiagonalMatrix *)(rhs_values + 0xe),(vec *)(bs_values + 0xe),(vec *)local_140,
             (vec *)&m.size);
  rhs_values[0xb] = 0.0;
  rhs_values[0xc] = 0.0;
  rhs_values[9] = 0.0;
  rhs_values[10] = 0.0;
  rhs_values[7] = 1.0;
  rhs_values[8] = 0.0;
  rhs_values[5] = 12.6;
  rhs_values[6] = 0.3;
  rhs_values[3] = (double)0x4021333333333333;
  rhs_values[4] = 26.0;
  rhs_values[1] = 1.0;
  rhs_values[2] = 0.9;
  rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x401c000000000000;
  rhs_values[0] = 6.5;
  rhs_values[0xd] = 0.0;
  make_vector((vec *)(xs_values + 0xe),0xf,
              (double *)
              &rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  xs_values[0xb] = 0.0;
  xs_values[0xc] = 0.0;
  xs_values[9] = 0.0;
  xs_values[10] = 0.0;
  xs_values[7] = -1.0;
  xs_values[8] = 0.0;
  xs_values[5] = 4.0;
  xs_values[6] = -2.0;
  xs_values[3] = 2.0;
  xs_values[4] = -3.0;
  xs_values[1] = -1.0;
  xs_values[2] = 0.0;
  xs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  xs_values[0] = 2.0;
  xs_values[0xd] = 0.0;
  make_vector((vec *)&solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0xf,
              (double *)
              &xs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  cyclic_reduction((vec *)&gtest_ar.message_,(TridiagonalMatrix *)(rhs_values + 0xe),
                   (vec *)(xs_values + 0xe));
  local_380 = max_diff((vec *)&solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(vec *)&gtest_ar.message_);
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_378,"max_diff(xs, solution)","EPS",&local_380,&EPS);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/antonlarin[P]hecr/common/tests.cpp"
               ,0x92,message);
    testing::internal::AssertHelper::operator=(&local_390,&local_388);
    testing::internal::AssertHelper::~AssertHelper(&local_390);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&gtest_ar.message_);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)(xs_values + 0xe));
  TridiagonalMatrix::~TridiagonalMatrix((TridiagonalMatrix *)(rhs_values + 0xe));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&m.size);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_140);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)(bs_values + 0xe));
  return;
}

Assistant:

TEST(HecrSequential, cyclicReductionExtendedMatrix)
{
    int size = 15;
    const double as_values[] = { 3, 4, 3, 7, 5.5, -6, 4, -1, 3,
        1, 1, 1, 1, 1, 1 };
    vec as = make_vector(size, as_values);
    const double bs_values[] = { 0, -1, 2, 1.1, 3.2, 2, 1, -0.3, -2,
        0, 0, 0, 0, 0, 0 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] = { 2, 0.5, -0.7, 1, 0.8, 1, 0.2, 0.5, 0,
        0, 0, 0, 0, 0, 0 };
    vec cs = make_vector(size, cs_values);
    TridiagonalMatrix m(as, bs, cs);
    const double rhs_values[] = { 7, 6.5, 1, 0.9, 8.6, 26, 12.6, 0.3, 1,
        0, 0, 0, 0, 0, 0 };
    vec rhs = make_vector(size, rhs_values);
    const double xs_values[] = { 1, 2, -1, 0, 2, -3, 4, -2, -1,
        0, 0, 0, 0, 0, 0 };
    vec xs = make_vector(size, xs_values);

    vec solution = cyclic_reduction(m, rhs);

    EXPECT_LT(max_diff(xs, solution), EPS);
}